

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelDescriptor.cpp
# Opt level: O0

void amrex::ParallelDescriptor::ReadAndBcastFile
               (string *filename,Vector<char,_std::allocator<char>_> *charBuf,bool bExitOnError,
               MPI_Comm *comm)

{
  size_t sVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  int iVar5;
  string *file;
  Vector<char,_std::allocator<char>_> *this;
  char *pcVar6;
  MPI_Comm *in_RCX;
  byte in_DL;
  undefined1 auVar7 [16];
  ifstream iss;
  Long fileLengthPadded;
  Long fileLength;
  Vector<char,_std::allocator<char>_> io_buffer;
  size_type in_stack_fffffffffffffd28;
  Vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  undefined1 local_278 [16];
  char local_268 [520];
  size_t local_60;
  long local_58 [3];
  allocator<char> local_39 [25];
  MPI_Comm *local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  Vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(allocator_type *)0xf72033);
  std::allocator<char>::~allocator(local_39);
  local_58[0] = 0;
  local_60 = 0;
  std::ifstream::ifstream(local_268);
  bVar2 = IOProcessor();
  auVar7._8_8_ = in_stack_fffffffffffffd48;
  auVar7._0_8_ = in_stack_fffffffffffffd50;
  if (bVar2) {
    pcVar6 = (char *)std::ifstream::rdbuf();
    file = (string *)
           Vector<char,_std::allocator<char>_>::dataPtr
                     ((Vector<char,_std::allocator<char>_> *)0xf72097);
    Vector<char,_std::allocator<char>_>::size((Vector<char,_std::allocator<char>_> *)0xf720a6);
    std::streambuf::pubsetbuf(pcVar6,(long)file);
    _Var4 = std::__cxx11::string::c_str();
    std::ifstream::open(local_268,_Var4);
    bVar3 = std::ios::good();
    auVar7._8_8_ = in_stack_fffffffffffffd48;
    auVar7._0_8_ = in_stack_fffffffffffffd50;
    if ((bVar3 & 1) == 0) {
      if ((local_11 & 1) == 0) {
        local_58[0] = -1;
      }
      else {
        FileOpenFailed(file);
        auVar7._8_8_ = in_stack_fffffffffffffd48;
        auVar7._0_8_ = in_stack_fffffffffffffd50;
      }
    }
    else {
      std::istream::seekg((long)local_268,_S_beg);
      auVar7 = std::istream::tellg();
      local_278 = auVar7;
      local_58[0] = std::fpos::operator_cast_to_long((fpos *)local_278);
      std::istream::seekg((long)local_268,_S_beg);
    }
  }
  iVar5 = IOProcessorNumber();
  Bcast<long>(local_58,1,iVar5,local_20);
  if (local_58[0] != -1) {
    local_60 = local_58[0] + 1;
    std::vector<char,_std::allocator<char>_>::resize(auVar7._0_8_,auVar7._8_8_);
    bVar2 = IOProcessor();
    if (bVar2) {
      pcVar6 = Vector<char,_std::allocator<char>_>::dataPtr
                         ((Vector<char,_std::allocator<char>_> *)0xf7227b);
      std::istream::read(local_268,(long)pcVar6);
      std::ifstream::close();
    }
    this = (Vector<char,_std::allocator<char>_> *)
           Vector<char,_std::allocator<char>_>::dataPtr
                     ((Vector<char,_std::allocator<char>_> *)0xf722ad);
    sVar1 = local_60;
    iVar5 = IOProcessorNumber();
    Bcast<char>((char *)this,sVar1,iVar5,local_20);
    pcVar6 = Vector<char,_std::allocator<char>_>::operator[](this,in_stack_fffffffffffffd28);
    *pcVar6 = '\0';
  }
  std::ifstream::~ifstream(local_268);
  Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0xf72316);
  return;
}

Assistant:

void
ReadAndBcastFile (const std::string& filename, Vector<char>& charBuf,
                  bool bExitOnError, const MPI_Comm&comm)
{
    enum { IO_Buffer_Size = 262144 * 8 };

#ifdef BL_SETBUF_SIGNED_CHAR
    typedef signed char Setbuf_Char_Type;
#else
    typedef char Setbuf_Char_Type;
#endif

    Vector<Setbuf_Char_Type> io_buffer(IO_Buffer_Size);

    Long fileLength(0), fileLengthPadded(0);

    std::ifstream iss;

    if (ParallelDescriptor::IOProcessor()) {
        iss.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
        iss.open(filename.c_str(), std::ios::in);
        if ( ! iss.good()) {
          if(bExitOnError) {
            amrex::FileOpenFailed(filename);
          } else {
            fileLength = -1;
          }
        } else {
          iss.seekg(0, std::ios::end);
          fileLength = static_cast<std::streamoff>(iss.tellg());
          iss.seekg(0, std::ios::beg);
        }
    }
    ParallelDescriptor::Bcast(&fileLength, 1,
                              ParallelDescriptor::IOProcessorNumber(), comm);

    if(fileLength == -1) {
      return;
    }

    fileLengthPadded = fileLength + 1;
//    fileLengthPadded += fileLengthPadded % 8;
    charBuf.resize(fileLengthPadded);
    if (ParallelDescriptor::IOProcessor()) {
        iss.read(charBuf.dataPtr(), fileLength);
        iss.close();
    }
    ParallelDescriptor::Bcast(charBuf.dataPtr(), fileLengthPadded,
                              ParallelDescriptor::IOProcessorNumber(), comm);
    charBuf[fileLength] = '\0';
}